

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlOutputBufferClose(xmlOutputBufferPtr out)

{
  int iVar1;
  int iVar2;
  int local_1c;
  int code;
  int ret;
  xmlOutputBufferPtr out_local;
  
  if (out == (xmlOutputBufferPtr)0x0) {
    out_local._4_4_ = -1;
  }
  else {
    if (out->writecallback != (xmlOutputWriteCallback)0x0) {
      xmlOutputBufferFlush(out);
    }
    if (((out->closecallback != (xmlOutputCloseCallback)0x0) &&
        (iVar1 = (*out->closecallback)(out->context), iVar1 != 0)) &&
       (iVar2 = xmlIsCatastrophicError(3,out->error), iVar2 == 0)) {
      if (iVar1 < 0) {
        out->error = 0x5dc;
      }
      else {
        out->error = iVar1;
      }
    }
    if (out->error == 0) {
      local_1c = out->written;
    }
    else {
      local_1c = -out->error;
    }
    if (out->conv != (xmlBufPtr)0x0) {
      xmlBufFree(out->conv);
      out->conv = (xmlBufPtr)0x0;
    }
    if (out->encoder != (xmlCharEncodingHandlerPtr)0x0) {
      xmlCharEncCloseFunc(out->encoder);
    }
    if (out->buffer != (xmlBufPtr)0x0) {
      xmlBufFree(out->buffer);
      out->buffer = (xmlBufPtr)0x0;
    }
    (*xmlFree)(out);
    out_local._4_4_ = local_1c;
  }
  return out_local._4_4_;
}

Assistant:

int
xmlOutputBufferClose(xmlOutputBufferPtr out)
{
    int ret;

    if (out == NULL)
        return (-1);

    if (out->writecallback != NULL)
        xmlOutputBufferFlush(out);

    if (out->closecallback != NULL) {
        int code = out->closecallback(out->context);

        if ((code != XML_ERR_OK) &&
            (!xmlIsCatastrophicError(XML_ERR_FATAL, out->error))) {
            if (code < 0)
                out->error = XML_IO_UNKNOWN;
            else
                out->error = code;
        }
    }

    if (out->error != XML_ERR_OK)
        ret = -out->error;
    else
        ret = out->written;

    if (out->conv) {
        xmlBufFree(out->conv);
        out->conv = NULL;
    }
    if (out->encoder != NULL) {
        xmlCharEncCloseFunc(out->encoder);
    }
    if (out->buffer != NULL) {
        xmlBufFree(out->buffer);
        out->buffer = NULL;
    }

    xmlFree(out);

    return(ret);
}